

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory.h
# Opt level: O2

Own<kj::NetworkAddress> * __thiscall
kj::Own<kj::NetworkAddress>::operator=(Own<kj::NetworkAddress> *this,Own<kj::NetworkAddress> *other)

{
  Disposer *object;
  Dispose_<kj::NetworkAddress,_true> *this_00;
  NetworkAddress *pNVar1;
  Disposer *in_RDX;
  
  object = this->disposer;
  this_00 = (Dispose_<kj::NetworkAddress,_true> *)this->ptr;
  pNVar1 = other->ptr;
  this->disposer = other->disposer;
  this->ptr = pNVar1;
  other->ptr = (NetworkAddress *)0x0;
  if (this_00 != (Dispose_<kj::NetworkAddress,_true> *)0x0) {
    Disposer::Dispose_<kj::NetworkAddress,_true>::dispose(this_00,(NetworkAddress *)object,in_RDX);
  }
  return this;
}

Assistant:

inline Own& operator=(Own&& other) {
    // Move-assingnment operator.

    // Careful, this might own `other`.  Therefore we have to transfer the pointers first, then
    // dispose.
    const Disposer* disposerCopy = disposer;
    T* ptrCopy = ptr;
    disposer = other.disposer;
    ptr = other.ptr;
    other.ptr = nullptr;
    if (ptrCopy != nullptr) {
      disposerCopy->dispose(const_cast<RemoveConst<T>*>(ptrCopy));
    }
    return *this;
  }